

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

Value * system_function_print(Value *context_value,TupleValue *parameter_values)

{
  Value *pVVar1;
  ulong uVar2;
  
  if (parameter_values->length != 0) {
    if (parameter_values->length != 0) {
      uVar2 = 0;
      do {
        pVVar1 = convert_to_string_value(parameter_values->items[uVar2]);
        printf("%s",*(undefined8 *)(pVVar1 + 1));
        if (uVar2 != parameter_values->length - 1) {
          putchar(0x20);
        }
        free_value(pVVar1);
        uVar2 = uVar2 + 1;
      } while (uVar2 < parameter_values->length);
    }
    putchar(10);
  }
  pVVar1 = new_null_value();
  return pVVar1;
}

Assistant:

Value *system_function_print(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) {
    return new_null_value();
  }

  for (size_t i = 0; i < parameter_values->length; i++) {
    StringValue *string_value = (StringValue *) convert_to_string_value(parameter_values->items[i]);

    printf("%s", string_value->string_value);

    if (i != parameter_values->length - 1) {
      printf(" ");
    }

    free_value((Value *) string_value);
  }

  printf("\n");

  return new_null_value();
}